

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O1

int qRegisterNormalizedMetaTypeImplementation<std::pair<QMarginsF,QPageLayout::Unit>>
              (QByteArray *normalizedTypeName)

{
  char cVar1;
  bool bVar2;
  __atomic_base<int> _Var3;
  long in_FS_OFFSET;
  char *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  _Var3._M_i = (__int_type)
               QtPrivate::QMetaTypeInterfaceWrapper<std::pair<QMarginsF,_QPageLayout::Unit>_>::
               metaType.typeId._q_value.super___atomic_base<int>._M_i;
  if ((__atomic_base<int>)
      QtPrivate::QMetaTypeInterfaceWrapper<std::pair<QMarginsF,_QPageLayout::Unit>_>::metaType.
      typeId._q_value.super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
    _Var3._M_i = QMetaType::registerHelper
                           (&QtPrivate::
                             QMetaTypeInterfaceWrapper<std::pair<QMarginsF,_QPageLayout::Unit>_>::
                             metaType);
  }
  cVar1 = QtPrivate::hasRegisteredConverterFunctionToPairVariantInterface((QMetaType)0x16a0e8);
  if (cVar1 == '\0') {
    QMetaType::
    registerConverter<std::pair<QMarginsF,QPageLayout::Unit>,QtMetaTypePrivate::QPairVariantInterfaceImpl,QtMetaTypePrivate::QPairVariantInterfaceConvertFunctor<std::pair<QMarginsF,QPageLayout::Unit>>>
              ();
  }
  local_20 = QtPrivate::QMetaTypeInterfaceWrapper<std::pair<QMarginsF,_QPageLayout::Unit>_>::
             metaType.name;
  bVar2 = operator!=(normalizedTypeName,&local_20);
  if (bVar2) {
    QMetaType::registerNormalizedTypedef(normalizedTypeName,(QMetaType)0x16a0e8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return _Var3._M_i;
  }
  __stack_chk_fail();
}

Assistant:

int qRegisterNormalizedMetaTypeImplementation(const QT_PREPEND_NAMESPACE(QByteArray) &normalizedTypeName)
{
#ifndef QT_NO_QOBJECT
    Q_ASSERT_X(normalizedTypeName == QMetaObject::normalizedType(normalizedTypeName.constData()),
               "qRegisterNormalizedMetaType",
               "qRegisterNormalizedMetaType was called with a not normalized type name, "
               "please call qRegisterMetaType instead.");
#endif

    const QMetaType metaType = QMetaType::fromType<T>();
    const int id = metaType.id();

    QtPrivate::SequentialContainerTransformationHelper<T>::registerConverter();
    QtPrivate::SequentialContainerTransformationHelper<T>::registerMutableView();
    QtPrivate::AssociativeContainerTransformationHelper<T>::registerConverter();
    QtPrivate::AssociativeContainerTransformationHelper<T>::registerMutableView();
    QtPrivate::MetaTypePairHelper<T>::registerConverter();
    QtPrivate::MetaTypeSmartPointerHelper<T>::registerConverter();
#if QT_CONFIG(future)
    QtPrivate::MetaTypeQFutureHelper<T>::registerConverter();
#endif

    if (normalizedTypeName != metaType.name())
        QMetaType::registerNormalizedTypedef(normalizedTypeName, metaType);

    return id;
}